

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HTS_model.c
# Opt level: O3

void HTS_ModelSet_get_duration(HTS_ModelSet *ms,char *string,double *iw,double *mean,double *vari)

{
  double weight;
  size_t sVar1;
  ulong uVar2;
  size_t sVar3;
  long lVar4;
  ulong uVar5;
  
  sVar1 = ms->num_states;
  if (sVar1 != 0) {
    sVar3 = 0;
    do {
      mean[sVar3] = 0.0;
      vari[sVar3] = 0.0;
      sVar3 = sVar3 + 1;
    } while (sVar1 != sVar3);
  }
  uVar2 = ms->num_voices;
  if (uVar2 != 0) {
    lVar4 = 0;
    uVar5 = 0;
    do {
      weight = iw[uVar5];
      if ((weight != 0.0) || (NAN(weight))) {
        HTS_Model_add_parameter
                  ((HTS_Model *)((long)&ms->duration->vector_length + lVar4),2,string,mean,vari,
                   (double *)0x0,weight);
        uVar2 = ms->num_voices;
      }
      uVar5 = uVar5 + 1;
      lVar4 = lVar4 + 0x40;
    } while (uVar5 < uVar2);
  }
  return;
}

Assistant:

void HTS_ModelSet_get_duration(HTS_ModelSet * ms, const char *string, const double *iw, double *mean, double *vari)
{
   size_t i;
   size_t len = ms->num_states;

   for (i = 0; i < len; i++) {
      mean[i] = 0.0;
      vari[i] = 0.0;
   }
   for (i = 0; i < ms->num_voices; i++)
      if (iw[i] != 0.0)
         HTS_Model_add_parameter(&ms->duration[i], 2, string, mean, vari, NULL, iw[i]);
}